

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::get_codes_to_canonical_deg<2,int>(Omega_h *this,Read<int> *ev2v)

{
  Alloc *pAVar1;
  int size_in;
  void *extraout_RDX;
  size_t sVar2;
  Read<signed_char> RVar3;
  allocator local_59;
  type f;
  Write<signed_char> codes;
  Write<signed_char> local_28;
  
  pAVar1 = (ev2v->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  size_in = divide_no_remainder<int>((int)(sVar2 >> 2),2);
  std::__cxx11::string::string((string *)&f,"",&local_59);
  Write<signed_char>::Write(&codes,size_in,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<int>::Write((Write<int> *)&f,&ev2v->write_);
  Write<signed_char>::Write(&f.codes,&codes);
  parallel_for<Omega_h::get_codes_to_canonical_deg<2,int>(Omega_h::Read<int>)::_lambda(int)_1_>
            (size_in,&f);
  Write<signed_char>::Write(&local_28,&codes);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_28);
  Write<signed_char>::~Write(&local_28);
  get_codes_to_canonical_deg<2,int>(Omega_h::Read<int>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&f);
  Write<signed_char>::~Write(&codes);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<I8> get_codes_to_canonical_deg(Read<T> const ev2v) {
  auto const nev = ev2v.size();
  auto const ne = divide_no_remainder(nev, deg);
  Write<I8> codes(ne);
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto const begin = e * deg;
    /* find the smallest vertex */
    Int min_j = 0;
    auto min_v = ev2v[begin];
    for (Int j = 1; j < deg; ++j) {
      auto const ev = j + begin;
      auto const v = ev2v[ev];
      if (v < min_v) {
        min_j = j;
        min_v = v;
      }
    }
    /* rotate to make it first */
    auto const rotation = rotation_to_first(deg, min_j);
    T tmp[deg];
    rotate_adj<deg>(rotation, ev2v, begin, tmp, 0);
    auto const is_flipped = IsFlipped<deg>::is(tmp);
    codes[e] = make_code(is_flipped, rotation, 0);
  };
  parallel_for(ne, std::move(f));
  return codes;
}